

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

bt_peer_connection * __thiscall libtorrent::aux::torrent::find_peer(torrent *this,endpoint *ep)

{
  pointer pppVar1;
  bt_peer_connection *pbVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  pointer pppVar5;
  
  pppVar5 = (this->super_torrent_hot_members).m_connections.
            super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            .
            super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pppVar1 = (this->super_torrent_hot_members).m_connections.
            super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            .
            super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pppVar5 == pppVar1) {
      return (bt_peer_connection *)0x0;
    }
    pbVar2 = (bt_peer_connection *)*pppVar5;
    iVar4 = (*(pbVar2->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[4])
                      (pbVar2);
    if ((char)iVar4 == '\0') {
      iVar4 = (*(pbVar2->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0x10])
                        (pbVar2);
      bVar3 = boost::asio::ip::detail::operator==
                        ((endpoint *)CONCAT44(extraout_var,iVar4),&ep->impl_);
      if (bVar3) {
        return pbVar2;
      }
    }
    pppVar5 = pppVar5 + 1;
  } while( true );
}

Assistant:

bt_peer_connection* torrent::find_peer(tcp::endpoint const& ep) const
	{
		for (auto* p : m_connections)
		{
			TORRENT_INCREMENT(m_iterating_connections);
			if (p->type() != connection_type::bittorrent) continue;
			if (p->remote() == ep) return static_cast<bt_peer_connection*>(p);
		}
		return nullptr;
	}